

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

qint64 __thiscall
QHttpNetworkReplyPrivate::readReplyBodyRaw
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *out,qint64 size)

{
  longlong *plVar1;
  QByteDataBuffer *this_00;
  long lVar2;
  long in_RCX;
  QByteArray *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qint64 haveRead;
  int toBeRead;
  qint64 bytes;
  QByteArray byteData;
  QByteArray *in_stack_ffffffffffffff50;
  QByteArray *bd;
  int local_7c;
  long local_78;
  qint64 local_58;
  longlong local_50 [2];
  QByteArray local_40;
  long local_28;
  longlong local_20 [2];
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 0;
  local_20[1] = 0x20000;
  local_10 = in_RCX;
  local_20[0] = (**(code **)&(in_RSI->d).d[10].super_QArrayData)();
  plVar1 = qMin<long_long>(&local_10,local_20);
  plVar1 = qMin<long_long>(local_20 + 1,plVar1);
  local_7c = (int)*plVar1;
  if (*(long *)(in_RDI + 0x150) != 0) {
    local_28 = (long)local_7c;
    plVar1 = qMin<long_long>(&local_28,(longlong *)(in_RDI + 0x150));
    local_7c = (int)*plVar1;
  }
  do {
    if (local_7c < 1) {
      local_58 = local_78;
      break;
    }
    local_40.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_40.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_40.d.size = -0x5555555555555556;
    QByteArray::QByteArray((QByteArray *)0x3065b4);
    QByteArray::resize((longlong)&local_40);
    bd = in_RSI;
    this_00 = (QByteDataBuffer *)QByteArray::data(in_stack_ffffffffffffff50);
    QByteArray::size(&local_40);
    lVar2 = QIODevice::read((char *)bd,(longlong)this_00);
    if (0 < lVar2) {
      QByteArray::resize((longlong)&local_40);
      QByteDataBuffer::append(this_00,bd);
      local_78 = lVar2 + local_78;
      local_10 = local_10 - lVar2;
      local_50[1] = 0x20000;
      local_50[0] = (**(code **)&(in_RSI->d).d[10].super_QArrayData)();
      plVar1 = qMin<long_long>(&local_10,local_50);
      plVar1 = qMin<long_long>(local_50 + 1,plVar1);
      local_7c = (int)*plVar1;
    }
    else {
      QByteArray::clear();
      local_58 = local_78;
    }
    QByteArray::~QByteArray((QByteArray *)0x3066bf);
  } while (0 < lVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readReplyBodyRaw(QIODevice *socket, QByteDataBuffer *out, qint64 size)
{
    // FIXME get rid of this function and just use readBodyFast and give it socket->bytesAvailable()
    qint64 bytes = 0;
    Q_ASSERT(socket);
    Q_ASSERT(out);

    int toBeRead = qMin<qint64>(128*1024, qMin<qint64>(size, socket->bytesAvailable()));

    if (readBufferMaxSize)
        toBeRead = qMin<qint64>(toBeRead, readBufferMaxSize);

    while (toBeRead > 0) {
        QByteArray byteData;
        byteData.resize(toBeRead);
        qint64 haveRead = socket->read(byteData.data(), byteData.size());
        if (haveRead <= 0) {
            // ### error checking here
            byteData.clear();
            return bytes;
        }

        byteData.resize(haveRead);
        out->append(byteData);
        bytes += haveRead;
        size -= haveRead;

        toBeRead = qMin<qint64>(128*1024, qMin<qint64>(size, socket->bytesAvailable()));
    }
    return bytes;

}